

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O2

bool anon_unknown.dwarf_a6c3::isAllowedToMemmove
               (Options *options,uint8_t *start,iterator indexStart,iterator indexEnd,
               ValueLength offsetSize)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  if ((options->paddingBehavior != NoPadding) &&
     (options->paddingBehavior != Flexible || offsetSize != 1)) {
    return false;
  }
  uVar2 = (long)indexEnd._M_current - (long)indexStart._M_current >> 3;
  uVar3 = offsetSize * -2 + 8;
  if (uVar2 < uVar3) {
    uVar3 = uVar2;
  }
  uVar2 = 0;
  do {
    bVar4 = uVar3 == uVar2;
    if (bVar4) {
      return bVar4;
    }
    puVar1 = indexStart._M_current + uVar2;
    uVar2 = uVar2 + 1;
  } while (start[*puVar1] != '\0');
  return bVar4;
}

Assistant:

bool isAllowedToMemmove(Options const* options, uint8_t const* start,
                        std::vector<ValueLength>::iterator indexStart,
                        std::vector<ValueLength>::iterator indexEnd,
                        ValueLength offsetSize) {
  VELOCYPACK_ASSERT(offsetSize == 1 || offsetSize == 2);

  if (options->paddingBehavior == Options::PaddingBehavior::NoPadding ||
      (offsetSize == 1 &&
       options->paddingBehavior == Options::PaddingBehavior::Flexible)) {
    std::size_t const distance = std::distance(indexStart, indexEnd);
    std::size_t const n = (std::min)(std::size_t(8 - 2 * offsetSize), distance);
    for (std::size_t i = 0; i < n; i++) {
      if (start[indexStart[i]] == 0x00) {
        return false;
      }
    }
    return true;
  }

  return false;
}